

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

box3f * __thiscall pbrt::TriangleMesh::getBounds(box3f *__return_storage_ptr__,TriangleMesh *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar5;
  undefined4 uVar6;
  ulong uVar3;
  undefined8 uVar4;
  pointer pvVar7;
  uint uVar8;
  undefined8 *in_RCX;
  pointer pvVar9;
  TriangleMesh *pTVar10;
  box3f *pbVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar24;
  float fVar25;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar31;
  float fVar32;
  float fVar36;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar37;
  float fVar39;
  float fVar40;
  float fVar41;
  undefined1 auVar38 [16];
  float fVar42;
  float fVar43;
  float fVar46;
  float fVar47;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar48;
  float fVar49;
  float fVar52;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar54;
  undefined1 auVar53 [16];
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar63;
  float fVar64;
  undefined1 auVar62 [16];
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar68 [16];
  float fVar72;
  float fVar73;
  float fVar75;
  float fVar76;
  float fVar77;
  undefined1 auVar74 [16];
  
  if (this->haveComputedBounds == false) {
    pTVar10 = this;
    uVar8 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
    if (uVar8 != 0) {
      pbVar11 = (box3f *)(ulong)uVar8;
      std::__throw_system_error(uVar8);
      fVar32 = *(float *)&(pTVar10->vertex).
                          super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>.
                          _M_impl.super__Vector_impl_data._M_start;
      fVar17 = *(float *)(in_RCX + 1);
      uVar4 = *(undefined8 *)
               ((long)&(pTVar10->vertex).
                       super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>.
                       _M_impl.super__Vector_impl_data._M_start + 4);
      fVar60 = *(float *)((long)in_RCX + 0x14);
      fVar66 = *(float *)(in_RCX + 4);
      fVar37 = (float)uVar4;
      fVar21 = (float)((ulong)uVar4 >> 0x20);
      fVar59 = fVar21 * fVar66 + fVar32 * fVar17 + fVar37 * fVar60;
      fVar15 = *(float *)((long)&(pTVar10->vertex).
                                 super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>
                                 ._M_impl.super__Vector_impl_data._M_finish + 4);
      pvVar9 = (pTVar10->vertex).
               super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      fVar22 = SUB84(pvVar9,0);
      fVar41 = (float)((ulong)pvVar9 >> 0x20);
      fVar24 = fVar66 * fVar41 + fVar17 * fVar15 + fVar60 * fVar22;
      fVar23 = *(float *)&(pTVar10->normal).
                          super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>.
                          _M_impl.super__Vector_impl_data._M_start;
      uVar4 = *(undefined8 *)
               ((long)&(pTVar10->normal).
                       super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>.
                       _M_impl.super__Vector_impl_data._M_start + 4);
      fVar16 = (float)uVar4;
      fVar25 = (float)((ulong)uVar4 >> 0x20);
      fVar49 = fVar66 * fVar25 + fVar17 * fVar23 + fVar60 * fVar16;
      uVar4 = *(undefined8 *)
               ((long)&(pTVar10->normal).
                       super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 4);
      fVar31 = (float)uVar4;
      fVar36 = (float)((ulong)uVar4 >> 0x20);
      fVar43 = *(float *)((long)in_RCX + 0x2c);
      (pbVar11->lower).x = 3.4028235e+38;
      (pbVar11->lower).y = 3.4028235e+38;
      *(undefined8 *)&(pbVar11->lower).z = 0xff7fffff7f7fffff;
      (pbVar11->upper).y = -3.4028235e+38;
      (pbVar11->upper).z = -3.4028235e+38;
      fVar28 = (float)*in_RCX;
      fVar29 = (float)((ulong)*in_RCX >> 0x20);
      fVar55 = (float)*(undefined8 *)((long)in_RCX + 0xc);
      fVar57 = (float)((ulong)*(undefined8 *)((long)in_RCX + 0xc) >> 0x20);
      fVar30 = (float)in_RCX[3];
      fVar56 = (float)((ulong)in_RCX[3] >> 0x20);
      fVar42 = fVar21 * fVar30 + fVar37 * fVar55 + fVar32 * fVar28;
      fVar46 = fVar21 * fVar56 + fVar37 * fVar57 + fVar32 * fVar29;
      fVar47 = fVar21 * 0.0 + fVar37 * 0.0 + fVar32 * 0.0;
      fVar48 = fVar21 * 0.0 + fVar37 * 0.0 + fVar32 * 0.0;
      fVar37 = fVar41 * fVar30 + fVar22 * fVar55 + fVar15 * fVar28;
      fVar39 = fVar41 * fVar56 + fVar22 * fVar57 + fVar15 * fVar29;
      fVar40 = fVar41 * 0.0 + fVar22 * 0.0 + fVar15 * 0.0;
      fVar41 = fVar41 * 0.0 + fVar22 * 0.0 + fVar15 * 0.0;
      fVar15 = fVar25 * fVar30 + fVar16 * fVar55 + fVar23 * fVar28;
      fVar21 = fVar25 * fVar56 + fVar16 * fVar57 + fVar23 * fVar29;
      fVar22 = fVar25 * 0.0 + fVar16 * 0.0 + fVar23 * 0.0;
      fVar23 = fVar25 * 0.0 + fVar16 * 0.0 + fVar23 * 0.0;
      uVar4 = *(undefined8 *)
               ((long)&(pTVar10->normal).
                       super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 4);
      fVar32 = (float)uVar4;
      fVar54 = (float)((ulong)uVar4 >> 0x20);
      fVar65 = fVar54 * fVar24;
      fVar52 = fVar59 * fVar54;
      fVar16 = -fVar54;
      fVar59 = fVar59 * fVar16;
      fVar24 = fVar24 * fVar16;
      fVar72 = fVar49 * fVar16;
      fVar55 = fVar32 * fVar30 + fVar36 * fVar55 + fVar31 * fVar28 +
               (float)*(undefined8 *)((long)in_RCX + 0x24);
      fVar56 = fVar32 * fVar56 + fVar36 * fVar57 + fVar31 * fVar29 +
               (float)((ulong)*(undefined8 *)((long)in_RCX + 0x24) >> 0x20);
      fVar57 = fVar32 * 0.0 + fVar36 * 0.0 + fVar31 * 0.0 + 0.0;
      fVar58 = fVar32 * 0.0 + fVar36 * 0.0 + fVar31 * 0.0 + 0.0;
      fVar25 = fVar42 * fVar16;
      fVar28 = fVar46 * fVar16;
      fVar29 = fVar47 * fVar16;
      fVar30 = fVar48 * fVar16;
      fVar67 = fVar37 * fVar16;
      fVar69 = fVar39 * fVar16;
      fVar70 = fVar40 * fVar16;
      fVar71 = fVar41 * fVar16;
      fVar73 = fVar25 + fVar67;
      fVar75 = fVar28 + fVar69;
      fVar76 = fVar29 + fVar70;
      fVar77 = fVar30 + fVar71;
      fVar61 = fVar16 * fVar15;
      fVar63 = fVar16 * fVar21;
      fVar64 = fVar16 * fVar22;
      fVar16 = fVar16 * fVar23;
      auVar33._0_8_ = CONCAT44(fVar75 + fVar63 + fVar56,fVar73 + fVar61 + fVar55);
      auVar33._8_4_ = fVar76 + fVar64 + fVar57;
      auVar33._12_4_ = fVar77 + fVar16 + fVar58;
      auVar18._8_4_ = auVar33._8_4_;
      auVar18._0_8_ = auVar33._0_8_;
      auVar18._12_4_ = auVar33._12_4_;
      auVar18 = minps(auVar18,_DAT_0014e7a0);
      auVar33 = maxps(auVar33,_DAT_0014a350);
      fVar15 = fVar15 * fVar54;
      fVar21 = fVar21 * fVar54;
      fVar22 = fVar22 * fVar54;
      fVar23 = fVar23 * fVar54;
      auVar74._0_8_ = CONCAT44(fVar75 + fVar21 + fVar56,fVar73 + fVar15 + fVar55);
      auVar74._8_4_ = fVar76 + fVar22 + fVar57;
      auVar74._12_4_ = fVar77 + fVar23 + fVar58;
      auVar12._8_4_ = auVar74._8_4_;
      auVar12._0_8_ = auVar74._0_8_;
      auVar12._12_4_ = auVar74._12_4_;
      auVar12 = minps(auVar12,auVar18);
      fVar73 = fVar65 + fVar59;
      fVar59 = fVar59 + fVar24;
      fVar65 = fVar65 + fVar52;
      fVar43 = fVar43 + fVar60 * fVar36 + fVar17 * fVar31 + fVar66 * fVar32;
      fVar17 = fVar59 + fVar72 + fVar43;
      fVar32 = fVar17;
      if (3.4028235e+38 <= fVar17) {
        fVar32 = 3.4028235e+38;
      }
      fVar49 = fVar49 * fVar54;
      fVar60 = fVar59 + fVar49 + fVar43;
      fVar66 = fVar60;
      if (fVar32 <= fVar60) {
        fVar66 = fVar32;
      }
      auVar18 = maxps(auVar74,auVar33);
      if (fVar17 <= -3.4028235e+38) {
        fVar17 = -3.4028235e+38;
      }
      if (fVar60 <= fVar17) {
        fVar60 = fVar17;
      }
      fVar37 = fVar37 * fVar54;
      fVar39 = fVar39 * fVar54;
      fVar40 = fVar40 * fVar54;
      fVar41 = fVar41 * fVar54;
      fVar25 = fVar25 + fVar37;
      fVar28 = fVar28 + fVar39;
      fVar29 = fVar29 + fVar40;
      fVar30 = fVar30 + fVar41;
      auVar13._0_8_ = CONCAT44(fVar28 + fVar63 + fVar56,fVar25 + fVar61 + fVar55);
      auVar13._8_4_ = fVar29 + fVar64 + fVar57;
      auVar13._12_4_ = fVar30 + fVar16 + fVar58;
      auVar19._8_4_ = auVar13._8_4_;
      auVar19._0_8_ = auVar13._0_8_;
      auVar19._12_4_ = auVar13._12_4_;
      auVar12 = minps(auVar19,auVar12);
      fVar32 = fVar73 + fVar72 + fVar43;
      fVar17 = fVar32;
      if (fVar66 <= fVar32) {
        fVar17 = fVar66;
      }
      auVar18 = maxps(auVar13,auVar18);
      if (fVar32 <= fVar60) {
        fVar32 = fVar60;
      }
      auVar26._0_8_ = CONCAT44(fVar28 + fVar21 + fVar56,fVar25 + fVar15 + fVar55);
      auVar26._8_4_ = fVar29 + fVar22 + fVar57;
      auVar26._12_4_ = fVar30 + fVar23 + fVar58;
      auVar38._8_4_ = auVar26._8_4_;
      auVar38._0_8_ = auVar26._0_8_;
      auVar38._12_4_ = auVar26._12_4_;
      auVar12 = minps(auVar38,auVar12);
      fVar66 = fVar73 + fVar49 + fVar43;
      fVar60 = fVar66;
      if (fVar17 <= fVar66) {
        fVar60 = fVar17;
      }
      auVar18 = maxps(auVar26,auVar18);
      if (fVar66 <= fVar32) {
        fVar66 = fVar32;
      }
      fVar52 = fVar52 + fVar24;
      fVar42 = fVar54 * fVar42;
      fVar46 = fVar54 * fVar46;
      fVar47 = fVar54 * fVar47;
      fVar54 = fVar54 * fVar48;
      fVar67 = fVar67 + fVar42;
      fVar69 = fVar69 + fVar46;
      fVar70 = fVar70 + fVar47;
      fVar71 = fVar71 + fVar54;
      auVar14._0_8_ = CONCAT44(fVar69 + fVar63 + fVar56,fVar67 + fVar61 + fVar55);
      auVar14._8_4_ = fVar70 + fVar64 + fVar57;
      auVar14._12_4_ = fVar71 + fVar16 + fVar58;
      auVar34._8_4_ = auVar14._8_4_;
      auVar34._0_8_ = auVar14._0_8_;
      auVar34._12_4_ = auVar14._12_4_;
      auVar12 = minps(auVar34,auVar12);
      fVar17 = fVar72 + fVar52 + fVar43;
      fVar32 = fVar17;
      if (fVar60 <= fVar17) {
        fVar32 = fVar60;
      }
      auVar18 = maxps(auVar14,auVar18);
      if (fVar17 <= fVar66) {
        fVar17 = fVar66;
      }
      fVar60 = fVar52 + fVar49 + fVar43;
      auVar68._0_8_ = CONCAT44(fVar69 + fVar21 + fVar56,fVar67 + fVar15 + fVar55);
      auVar68._8_4_ = fVar70 + fVar22 + fVar57;
      auVar68._12_4_ = fVar71 + fVar23 + fVar58;
      auVar20._8_4_ = auVar68._8_4_;
      auVar20._0_8_ = auVar68._0_8_;
      auVar20._12_4_ = auVar68._12_4_;
      auVar12 = minps(auVar20,auVar12);
      fVar66 = fVar60;
      if (fVar32 <= fVar60) {
        fVar66 = fVar32;
      }
      auVar18 = maxps(auVar68,auVar18);
      if (fVar60 <= fVar17) {
        fVar60 = fVar17;
      }
      fVar32 = fVar72 + fVar65 + fVar43;
      fVar42 = fVar42 + fVar37;
      fVar46 = fVar46 + fVar39;
      fVar47 = fVar47 + fVar40;
      fVar54 = fVar54 + fVar41;
      auVar62._0_8_ = CONCAT44(fVar63 + fVar46 + fVar56,fVar61 + fVar42 + fVar55);
      auVar62._8_4_ = fVar64 + fVar47 + fVar57;
      auVar62._12_4_ = fVar16 + fVar54 + fVar58;
      auVar35._8_4_ = auVar62._8_4_;
      auVar35._0_8_ = auVar62._0_8_;
      auVar35._12_4_ = auVar62._12_4_;
      auVar12 = minps(auVar35,auVar12);
      fVar17 = fVar32;
      if (fVar66 <= fVar32) {
        fVar17 = fVar66;
      }
      auVar18 = maxps(auVar62,auVar18);
      if (fVar32 <= fVar60) {
        fVar32 = fVar60;
      }
      fVar43 = fVar65 + fVar49 + fVar43;
      auVar53._0_8_ = CONCAT44(fVar46 + fVar21 + fVar56,fVar42 + fVar15 + fVar55);
      auVar53._8_4_ = fVar47 + fVar22 + fVar57;
      auVar53._12_4_ = fVar54 + fVar23 + fVar58;
      auVar27._8_4_ = auVar53._8_4_;
      auVar27._0_8_ = auVar53._0_8_;
      auVar27._12_4_ = auVar53._12_4_;
      auVar12 = minps(auVar27,auVar12);
      fVar60 = fVar43;
      if (fVar17 <= fVar43) {
        fVar60 = fVar17;
      }
      (pbVar11->lower).x = (float)(int)auVar12._0_8_;
      (pbVar11->lower).y = (float)(int)((ulong)auVar12._0_8_ >> 0x20);
      (pbVar11->lower).z = fVar60;
      auVar12 = maxps(auVar53,auVar18);
      if (fVar43 <= fVar32) {
        fVar43 = fVar32;
      }
      (pbVar11->upper).x = (float)(int)auVar12._0_8_;
      (pbVar11->upper).y = (float)(int)((ulong)auVar12._0_8_ >> 0x20);
      (pbVar11->upper).z = fVar43;
      return pbVar11;
    }
    if (this->haveComputedBounds == false) {
      (this->bounds).lower.x = 3.4028235e+38;
      (this->bounds).lower.y = 3.4028235e+38;
      *(undefined8 *)&(this->bounds).lower.z = 0xff7fffff7f7fffff;
      (this->bounds).upper.y = -3.4028235e+38;
      (this->bounds).upper.z = -3.4028235e+38;
      pvVar9 = (this->vertex).
               super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
               super__Vector_impl_data._M_start;
      pvVar7 = (this->vertex).
               super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pvVar9 != pvVar7) {
        uVar1 = (this->bounds).lower.x;
        uVar5 = (this->bounds).lower.y;
        auVar51._4_4_ = uVar5;
        auVar51._0_4_ = uVar1;
        auVar51._8_8_ = 0;
        uVar2 = (this->bounds).upper.x;
        uVar6 = (this->bounds).upper.y;
        auVar45._4_4_ = uVar6;
        auVar45._0_4_ = uVar2;
        auVar45._8_8_ = 0;
        fVar17 = (this->bounds).lower.z;
        fVar32 = -3.4028235e+38;
        do {
          fVar60 = pvVar9->z;
          uVar3._0_4_ = pvVar9->x;
          uVar3._4_4_ = pvVar9->y;
          auVar44._8_8_ = 0;
          auVar44._0_8_ = uVar3;
          auVar50._8_8_ = 0;
          auVar50._0_8_ = uVar3;
          auVar51 = minps(auVar50,auVar51);
          fVar66 = fVar60;
          if (fVar17 <= fVar60) {
            fVar66 = fVar17;
          }
          (this->bounds).lower.x = (float)(int)auVar51._0_8_;
          (this->bounds).lower.y = (float)(int)((ulong)auVar51._0_8_ >> 0x20);
          (this->bounds).lower.z = fVar66;
          auVar45 = maxps(auVar44,auVar45);
          if (fVar60 <= fVar32) {
            fVar60 = fVar32;
          }
          (this->bounds).upper.x = (float)(int)auVar45._0_8_;
          (this->bounds).upper.y = (float)(int)((ulong)auVar45._0_8_ >> 0x20);
          (this->bounds).upper.z = fVar60;
          pvVar9 = pvVar9 + 1;
          fVar17 = fVar66;
          fVar32 = fVar60;
        } while (pvVar9 != pvVar7);
      }
      this->haveComputedBounds = true;
    }
    fVar32 = (this->bounds).upper.z;
    (__return_storage_ptr__->upper).y = (this->bounds).upper.y;
    (__return_storage_ptr__->upper).z = fVar32;
    fVar32 = (this->bounds).lower.y;
    uVar4 = *(undefined8 *)&(this->bounds).lower.z;
    (__return_storage_ptr__->lower).x = (this->bounds).lower.x;
    (__return_storage_ptr__->lower).y = fVar32;
    *(undefined8 *)&(__return_storage_ptr__->lower).z = uVar4;
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  }
  else {
    fVar32 = (this->bounds).upper.z;
    (__return_storage_ptr__->upper).y = (this->bounds).upper.y;
    (__return_storage_ptr__->upper).z = fVar32;
    fVar32 = (this->bounds).lower.y;
    uVar4 = *(undefined8 *)&(this->bounds).lower.z;
    (__return_storage_ptr__->lower).x = (this->bounds).lower.x;
    (__return_storage_ptr__->lower).y = fVar32;
    *(undefined8 *)&(__return_storage_ptr__->lower).z = uVar4;
  }
  return __return_storage_ptr__;
}

Assistant:

box3f TriangleMesh::getBounds() 
  {
    if (!haveComputedBounds) {
      std::lock_guard<std::mutex> lock(mutex);
      if (haveComputedBounds) return bounds;
      bounds = box3f::empty_box();
      for (auto v : vertex) {
        bounds.extend(v);
      }
      
      haveComputedBounds = true;
      return bounds;
    }
    return bounds;
  }